

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<QGesture_*,_QObject_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGesture*,QObject*>>::findNode<QGesture*>
          (Data<QHashPrivate::Node<QGesture*,QObject*>> *this,QGesture **key)

{
  byte bVar1;
  Node<QGesture_*,_QObject_*> *pNVar2;
  ulong uVar3;
  Bucket BVar4;
  
  uVar3 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  BVar4 = findBucketWithHash<QGesture*>(this,key,uVar3 >> 0x20 ^ *(ulong *)(this + 0x18) ^ uVar3);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QGesture_*,_QObject_*> *)0x0;
  }
  else {
    pNVar2 = (Node<QGesture_*,_QObject_*> *)((BVar4.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }